

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

void * __thiscall lan::db::get_var_data(db *this,db_bit_type type,string *data)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  db *pdVar4;
  double dVar5;
  db_bits *pdVar6;
  string local_98;
  undefined1 local_75;
  string local_68;
  string local_48;
  string *local_28;
  string *data_local;
  db *pdStack_18;
  db_bit_type type_local;
  db *this_local;
  
  local_28 = data;
  data_local._4_4_ = type;
  pdStack_18 = this;
  switch(type) {
  case Bool:
    pdVar4 = (db *)operator_new(1);
    pcVar2 = (char *)std::__cxx11::string::data();
    iVar1 = atoi(pcVar2);
    *(bool *)&pdVar4->data = iVar1 != 0;
    this_local = pdVar4;
    break;
  case Int:
    pdVar4 = (db *)operator_new(4);
    pcVar2 = (char *)std::__cxx11::string::data();
    iVar1 = atoi(pcVar2);
    *(int *)&pdVar4->data = iVar1;
    this_local = pdVar4;
    break;
  case Long:
    pdVar4 = (db *)operator_new(8);
    pcVar2 = (char *)std::__cxx11::string::data();
    pdVar6 = (db_bits *)atol(pcVar2);
    pdVar4->data = pdVar6;
    this_local = pdVar4;
    break;
  case LongLong:
    pdVar4 = (db *)operator_new(8);
    pcVar2 = (char *)std::__cxx11::string::data();
    pdVar6 = (db_bits *)atoll(pcVar2);
    pdVar4->data = pdVar6;
    this_local = pdVar4;
    break;
  case Float:
    pdVar4 = (db *)operator_new(4);
    pcVar2 = (char *)std::__cxx11::string::data();
    dVar5 = atof(pcVar2);
    *(float *)&pdVar4->data = (float)dVar5;
    this_local = pdVar4;
    break;
  case Double:
    pdVar4 = (db *)operator_new(8);
    pcVar2 = (char *)std::__cxx11::string::data();
    pdVar6 = (db_bits *)strtod(pcVar2,(char **)0x0);
    pdVar4->data = pdVar6;
    this_local = pdVar4;
    break;
  case Char:
    pdVar4 = (db *)operator_new(1);
    local_75 = 1;
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_68,(ulong)data);
    prepare_string_to_read(&local_48,this,&local_68);
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&local_48);
    *(undefined1 *)&pdVar4->data = *puVar3;
    local_75 = 0;
    this_local = pdVar4;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case String:
    pdVar4 = (db *)operator_new(0x20);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_98,(ulong)data);
    prepare_string_to_read((string *)pdVar4,this,&local_98);
    this_local = pdVar4;
    std::__cxx11::string::~string((string *)&local_98);
    break;
  default:
    this_local = (db *)0x0;
  }
  return this_local;
}

Assistant:

void * db::get_var_data(db_bit_type type, std::string data){
            switch(type){
                case Bool: return new bool(atoi(data.data())); break;
                case Int:  return new int(atoi(data.data())); break;
                case Long: return new long(atol(data.data())); break;
                case LongLong: return new long long(atoll(data.data())); break;
                case Float: return new float(atof(data.data())); break;
                case Double: return new double(strtod(data.data(), nullptr));
                case Char: return new char(prepare_string_to_read(data.substr(1, data.length()-2))[0]);       break;
                case String: return new std::string(prepare_string_to_read(data.substr(1, data.length()-2))); break;
                default: return nullptr;
            }
        }